

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

int __thiscall QFile::open(QFile *this,char *__file,int __oflag,...)

{
  bool bVar1;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar2;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar3;
  int iVar4;
  QFilePrivate *file;
  __off64_t pos_00;
  undefined4 in_ECX;
  int __oflag_00;
  long in_FS_OFFSET;
  qint64 pos;
  QFilePrivate *d;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  byte bVar5;
  QFileDevice *in_stack_ffffffffffffff60;
  QMessageLogger *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  FILE *fh;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  bool local_45;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_44;
  uint local_40;
  undefined4 local_3c;
  QMessageLogger local_38;
  CompareAgainstLiteralZero local_15;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_14;
  undefined4 local_10;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_ECX;
  local_c.i = __oflag;
  file = d_func((QFile *)0x2a6373);
  bVar1 = QIODevice::isOpen(&in_stack_ffffffffffffff60->super_QIODevice);
  if (bVar1) {
    local_45 = file_already_open((QFile *)file,
                                 (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98));
  }
  else {
    ::operator|((enum_type)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                (enum_type)in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff60,
                    (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(this,0));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) {
      QFlags<QIODeviceBase::OpenModeFlag>::operator|=
                ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_c,WriteOnly);
    }
    QFileDevice::unsetError(in_stack_ffffffffffffff60);
    QVar2.i = (Int)::operator|((enum_type)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                               (enum_type)in_stack_ffffffffffffff60);
    QVar3.i = (Int)QFlags<QIODeviceBase::OpenModeFlag>::operator&
                             ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff60,
                              (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(this,0));
    iVar4 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    fh = (FILE *)0x0;
    QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_15,0);
    bVar1 = ::operator==(QVar3.i);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff70,(char *)this,iVar4,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(in_stack_ffffffffffffff5e,
                                           CONCAT24(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58))));
      QMessageLogger::warning(&local_38,"QFile::open: File access not specified");
      local_45 = false;
    }
    else {
      QVar3.i = (Int)QFlags<QIODeviceBase::OpenModeFlag>::operator|
                               ((QFlags<QIODeviceBase::OpenModeFlag> *)file,
                                CONCAT13(in_stack_ffffffffffffff5f,
                                         CONCAT12(in_stack_ffffffffffffff5e,
                                                  in_stack_ffffffffffffff5c)));
      local_3c = local_10;
      bVar1 = QFilePrivate::openExternalFile
                        ((QFilePrivate *)CONCAT44(QVar2.i,in_stack_ffffffffffffff90),
                         (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                         SUB84((ulong)__file >> 0x20,0),fh,
                         (QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4>)SUB84(__file,0));
      if (bVar1) {
        local_40 = local_c.i;
        QIODevice::open((QIODevice *)this,(char *)(ulong)local_c.i,__oflag_00);
        local_44.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
             (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
             QFlags<QIODeviceBase::OpenModeFlag>::operator&
                       ((QFlags<QIODeviceBase::OpenModeFlag> *)file,
                        CONCAT13(in_stack_ffffffffffffff5f,
                                 CONCAT12(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c)));
        bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_44);
        bVar5 = 0;
        if (!bVar1) {
          iVar4 = (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xc])();
          bVar5 = (byte)iVar4 ^ 0xff;
        }
        if (((bVar5 & 1) != 0) && (pos_00 = ftello64((FILE *)__file), pos_00 != -1)) {
          QIODevice::seek((QIODevice *)CONCAT44(QVar3.i,in_stack_ffffffffffffff78),pos_00);
        }
        local_45 = true;
      }
      else {
        local_45 = false;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_45);
}

Assistant:

bool QFile::open(FILE *fh, OpenMode mode, FileHandleFlags handleFlags)
{
    Q_D(QFile);
    if (isOpen())
        return file_already_open(*this);
    // Either Append or NewOnly implies WriteOnly
    if (mode & (Append | NewOnly))
        mode |= WriteOnly;
    unsetError();
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QFile::open: File access not specified");
        return false;
    }

    // QIODevice provides the buffering, so request unbuffered file engines
    if (d->openExternalFile(mode | Unbuffered, fh, handleFlags)) {
        QIODevice::open(mode);
        if (!(mode & Append) && !isSequential()) {
            qint64 pos = (qint64)QT_FTELL(fh);
            if (pos != -1) {
                // Skip redundant checks in QFileDevice::seek().
                QIODevice::seek(pos);
            }
        }
        return true;
    }
    return false;
}